

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall spirv_cross::ParsedIR::mark_used_as_array_length(ParsedIR *this,ID id)

{
  Variant *this_00;
  Types TVar1;
  int iVar2;
  size_t sVar3;
  SPIRConstantOp *pSVar4;
  SPIRConstant *pSVar5;
  ulong uVar6;
  long lVar7;
  uint32_t *puVar8;
  
  uVar6 = (ulong)id.id;
  do {
    this_00 = (this->ids).super_VectorView<spirv_cross::Variant>.ptr + uVar6;
    TVar1 = this_00->type;
    if (TVar1 != TypeConstantOp) {
      if (TVar1 != TypeUndef) {
        if (TVar1 != TypeConstant) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross_parsed_ir.cpp"
                        ,0x225,"void spirv_cross::ParsedIR::mark_used_as_array_length(ID)");
        }
        pSVar5 = Variant::get<spirv_cross::SPIRConstant>(this_00);
        pSVar5->is_used_as_array_length = true;
      }
      return;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRConstantOp>(this_00);
    iVar2 = *(int *)&(pSVar4->super_IVariant).field_0xc;
    puVar8 = (pSVar4->arguments).super_VectorView<unsigned_int>.ptr;
    if (iVar2 == 0x52) {
      mark_used_as_array_length(this,(ID)*puVar8);
      puVar8 = (pSVar4->arguments).super_VectorView<unsigned_int>.ptr + 1;
    }
    else if (iVar2 != 0x51) {
      sVar3 = (pSVar4->arguments).super_VectorView<unsigned_int>.buffer_size;
      if (sVar3 == 0) {
        return;
      }
      lVar7 = 0;
      do {
        mark_used_as_array_length(this,(ID)*(uint32_t *)((long)puVar8 + lVar7));
        lVar7 = lVar7 + 4;
      } while (sVar3 << 2 != lVar7);
      return;
    }
    uVar6 = (ulong)*puVar8;
  } while( true );
}

Assistant:

void ParsedIR::mark_used_as_array_length(ID id)
{
	switch (ids[id].get_type())
	{
	case TypeConstant:
		get<SPIRConstant>(id).is_used_as_array_length = true;
		break;

	case TypeConstantOp:
	{
		auto &cop = get<SPIRConstantOp>(id);
		if (cop.opcode == OpCompositeExtract)
			mark_used_as_array_length(cop.arguments[0]);
		else if (cop.opcode == OpCompositeInsert)
		{
			mark_used_as_array_length(cop.arguments[0]);
			mark_used_as_array_length(cop.arguments[1]);
		}
		else
			for (uint32_t arg_id : cop.arguments)
				mark_used_as_array_length(arg_id);
		break;
	}

	case TypeUndef:
		break;

	default:
		assert(0);
	}
}